

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::CBufferFlushMappedRange<glcts::(anonymous_namespace)::test_api::GL>::Run
          (CBufferFlushMappedRange<glcts::(anonymous_namespace)::test_api::GL> *this)

{
  CallLogWrapper *this_00;
  pointer *this_01;
  GLboolean GVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  void *pvVar4;
  uint uVar5;
  uint widthRef;
  uint in_R9D;
  uint uVar6;
  size_t __n;
  long lVar7;
  uint sizeX;
  ulong uVar8;
  uint in_stack_fffffffffffff368;
  allocator_type local_c89;
  CallLogWrapper *local_c88;
  ulong local_c80;
  CDataArray dataRef;
  CDataArray dataRef2;
  value_type_conflict4 local_c3c;
  CDataArray dataTest;
  DIResult result;
  DILogger local_930;
  DILogger local_7b0;
  DILogger local_630;
  DILogger local_4b0;
  DILogger local_330;
  DILogger local_1b0;
  
  result.logger_.null_log_ = false;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&result.logger_.str_);
  result.status_ = 0;
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_buffer);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_buffer);
  dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  uVar5 = 0x4000;
  if ((int)*(uint *)CONCAT44(extraout_var,iVar2) < 0x4000) {
    uVar5 = *(uint *)CONCAT44(extraout_var,iVar2);
  }
  iVar2 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  uVar6 = *(uint *)(CONCAT44(extraout_var_00,iVar2) + 4);
  uVar8 = (ulong)uVar6;
  if ((int)(0x10000 / (long)(int)uVar5) < (int)uVar6) {
    uVar8 = 0x10000 / (long)(int)uVar5 & 0xffffffff;
  }
  sizeX = (uint)uVar8;
  DrawIndirectBase::DataGen<unsigned_int>
            ((DrawIndirectBase *)&dataRef,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,sizeX,1,1000,in_R9D
            );
  dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DrawIndirectBase::DataGen<unsigned_int>
            ((DrawIndirectBase *)&dataRef2,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,sizeX,1000,2000,
             in_R9D);
  uVar6 = sizeX + 3;
  if (-1 < (int)sizeX) {
    uVar6 = sizeX;
  }
  local_c88 = this_00;
  glu::CallLogWrapper::glBufferData
            (this_00,0x8f3f,
             (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
             dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e8);
  lVar3 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                    (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
  DIResult::sub_result(&local_1b0,&result,lVar3);
  widthRef = (int)((int)(uVar8 >> 0x1f) + sizeX) >> 1;
  local_c80 = (ulong)(uint)((int)uVar6 >> 2);
  DILogger::~DILogger(&local_1b0);
  lVar3 = (long)(int)(((int)uVar6 >> 2) * uVar5);
  lVar7 = lVar3 * 4;
  __n = (long)(int)(widthRef * uVar5) << 2;
  pvVar4 = glu::CallLogWrapper::glMapBufferRange(local_c88,0x8f3f,lVar7,__n,0x12);
  if (pvVar4 == (void *)0x0) {
    result.status_ = -1;
    dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = '\0';
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)
               &dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&dataTest,
               (char (*) [74])
               "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_WRITE_BIT) returned NULL");
    DILogger::~DILogger((DILogger *)&dataTest);
  }
  else {
    lVar7 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\x01',0x88b9,0x12,lVar7,__n);
    DIResult::sub_result(&local_330,&result,lVar7);
    DILogger::~DILogger(&local_330);
    memcpy(pvVar4,dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar3,__n);
    glu::CallLogWrapper::glFlushMappedBufferRange(local_c88,0x8f3f,0,__n);
    GVar1 = glu::CallLogWrapper::glUnmapBuffer(local_c88,0x8f3f);
    if (GVar1 == '\0') {
      result.status_ = -1;
      this_01 = &dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = '\0';
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
      if ((char)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_01,
                   "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE",0x4a
                  );
      }
      DILogger::~DILogger((DILogger *)&dataTest);
    }
    lVar3 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
    DIResult::sub_result(&local_4b0,&result,lVar3);
    DILogger::~DILogger(&local_4b0);
  }
  local_c3c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&dataTest,(long)(int)(sizeX * uVar5),&local_c3c,&local_c89);
  glu::CallLogWrapper::glGetBufferSubData
            (local_c88,0x8f3f,0,
             (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)CONCAT71(dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._1_7_,
                            (char)dataTest.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start),
             (void *)CONCAT71(dataTest.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._1_7_,
                              (char)dataTest.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start));
  lVar3 = DrawIndirectBase::DataCompare<unsigned_int>
                    ((DrawIndirectBase *)&dataRef,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,
                     (uint)local_c80,(uint)&dataTest,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,
                     (uint)local_c80,0,0,in_stack_fffffffffffff368);
  DIResult::sub_result(&local_630,&result,lVar3);
  DILogger::~DILogger(&local_630);
  lVar3 = DrawIndirectBase::DataCompare<unsigned_int>
                    ((DrawIndirectBase *)&dataRef2,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,widthRef,
                     (uint)&dataTest,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,widthRef,
                     (uint)local_c80,(uint)local_c80,in_stack_fffffffffffff368);
  DIResult::sub_result(&local_7b0,&result,lVar3);
  DILogger::~DILogger(&local_7b0);
  iVar2 = sizeX * 3 + 3;
  if (-1 < (int)(sizeX * 3)) {
    iVar2 = sizeX * 3;
  }
  lVar3 = DrawIndirectBase::DataCompare<unsigned_int>
                    ((DrawIndirectBase *)&dataRef,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,
                     (uint)local_c80,(uint)&dataTest,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,
                     (uint)local_c80,iVar2 >> 2,iVar2 >> 2,in_stack_fffffffffffff368);
  DIResult::sub_result(&local_930,&result,lVar3);
  DILogger::~DILogger(&local_930);
  lVar3 = result.status_;
  pvVar4 = (void *)CONCAT71(dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._1_7_,
                            (char)dataTest.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)dataTest.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
  }
  if (dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  DILogger::~DILogger(&result.logger_);
  return lVar3;
}

Assistant:

virtual long Run()
	{
		DIResult result;

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffer);

		CDataArray dataRef;
		int		   dataWidth, dataHeight;
		getDataSize(dataWidth, dataHeight);
		DataGen<unsigned int>(dataRef, dataWidth, dataHeight, 1, 1000);

		CDataArray dataRef2;
		DataGen<unsigned int>(dataRef2, dataWidth, dataHeight, 1000, 2000);

		const int halfSize	= dataHeight / 2 * dataWidth;
		const int quarterSize = dataHeight / 4 * dataWidth;

		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef.size() * sizeof(unsigned int)), &dataRef[0],
					 GL_DYNAMIC_DRAW);

		result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));

		void* buf = glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, quarterSize * sizeof(unsigned int),
									 halfSize * sizeof(unsigned int), GL_MAP_WRITE_BIT | GL_MAP_FLUSH_EXPLICIT_BIT);

		if (buf == 0)
		{
			result.error() << "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_WRITE_BIT) returned NULL";
		}

		if (buf)
		{
			result.sub_result(StateValidate<api>(GL_TRUE, GL_WRITE_ONLY, GL_MAP_WRITE_BIT | GL_MAP_FLUSH_EXPLICIT_BIT,
												 quarterSize * sizeof(unsigned int), halfSize * sizeof(unsigned int)));

			memcpy(buf, &dataRef2[quarterSize], halfSize * sizeof(unsigned int));
			glFlushMappedBufferRange(GL_DRAW_INDIRECT_BUFFER, 0, halfSize * sizeof(unsigned int));

			if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) == GL_FALSE)
			{
				result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
			}
			buf = 0;

			result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));
		}

		CDataArray dataTest(dataWidth * dataHeight, 0);
		GetBufferSubData<api>(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataTest.size() * sizeof(unsigned int)),
							  &dataTest[0]);

		result.sub_result(DataCompare(dataRef, dataWidth, dataHeight / 4, dataTest, dataWidth, dataHeight / 4));

		result.sub_result(DataCompare(dataRef2, dataWidth, dataHeight / 2, dataTest, dataWidth, dataHeight / 2,
									  dataHeight / 4, dataHeight / 4));

		result.sub_result(DataCompare(dataRef, dataWidth, dataHeight / 4, dataTest, dataWidth, dataHeight / 4,
									  dataHeight * 3 / 4, dataHeight * 3 / 4));

		return result.code();
	}